

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive-list.h
# Opt level: O3

void __thiscall wabt::Module::AppendFields(Module *this,ModuleFieldList *fields)

{
  size_t sVar1;
  ModuleField *pMVar2;
  pointer *__ptr;
  ModuleField **ppMVar3;
  __uniq_ptr_impl<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_> local_28;
  
  sVar1 = fields->size_;
  if (sVar1 != 0) {
    do {
      local_28._M_t.
      super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
      super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl =
           (tuple<wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>)fields->first_;
      if (local_28._M_t.
          super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
          super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl ==
          (tuple<wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>)fields->last_) {
        pMVar2 = (ModuleField *)0x0;
        ppMVar3 = &fields->last_;
      }
      else {
        pMVar2 = (((ModuleField *)
                  local_28._M_t.
                  super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>
                  .super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl)->
                 super_intrusive_list_base<wabt::ModuleField>).next_;
        ppMVar3 = &(pMVar2->super_intrusive_list_base<wabt::ModuleField>).prev_;
      }
      *ppMVar3 = (ModuleField *)0x0;
      fields->first_ = pMVar2;
      (((ModuleField *)
       local_28._M_t.
       super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
       super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl)->
      super_intrusive_list_base<wabt::ModuleField>).next_ = (ModuleField *)0x0;
      (((ModuleField *)
       local_28._M_t.
       super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
       super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl)->
      super_intrusive_list_base<wabt::ModuleField>).prev_ = (ModuleField *)0x0;
      fields->size_ = sVar1 - 1;
      AppendField(this,(unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_> *)
                       &local_28);
      if ((_Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>)
          local_28._M_t.
          super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
          super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl != (ModuleField *)0x0) {
        (**(code **)(*(long *)local_28._M_t.
                              super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>
                              .super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl + 8))
                  ();
      }
      sVar1 = fields->size_;
    } while (sVar1 != 0);
  }
  return;
}

Assistant:

inline bool intrusive_list<T>::empty() const noexcept {
  return size_ == 0;
}